

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QGesture_*,_QGraphicsObject_*>_>::rehash
          (Data<QHashPrivate::Node<QGesture_*,_QGraphicsObject_*>_> *this,size_t sizeHint)

{
  uchar *puVar1;
  byte bVar2;
  ulong uVar3;
  Span *pSVar4;
  Entry *pEVar5;
  QGraphicsObject *pQVar6;
  Node<QGesture_*,_QGraphicsObject_*> *pNVar7;
  ulong uVar8;
  ulong uVar9;
  Span *pSVar10;
  size_t numBuckets;
  size_t index;
  long lVar11;
  long lVar12;
  R RVar13;
  Bucket BVar14;
  
  if (sizeHint == 0) {
    sizeHint = this->size;
  }
  numBuckets = 0x80;
  if ((0x40 < sizeHint) && (numBuckets = 0xffffffffffffffff, sizeHint >> 0x3e == 0)) {
    lVar11 = 0x3f;
    if (sizeHint != 0) {
      for (; sizeHint >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    numBuckets = 1L << (0x41 - ((byte)lVar11 ^ 0x3f) & 0x3f);
  }
  uVar3 = this->numBuckets;
  pSVar4 = this->spans;
  RVar13 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar13.spans;
  this->numBuckets = numBuckets;
  if (uVar3 < 0x80) {
    if (pSVar4 == (Span *)0x0) {
      return;
    }
  }
  else {
    uVar8 = 0;
    pSVar10 = pSVar4;
    do {
      lVar11 = 0;
      do {
        bVar2 = pSVar10->offsets[lVar11];
        if (bVar2 != 0xff) {
          pEVar5 = pSVar4[uVar8].entries;
          uVar9 = *(ulong *)pEVar5[bVar2].storage.data;
          uVar9 = (uVar9 >> 0x20 ^ uVar9) * -0x2917014799a6026d;
          uVar9 = (uVar9 >> 0x20 ^ uVar9) * -0x2917014799a6026d;
          BVar14 = Data<QHashPrivate::Node<QGesture*,QGraphicsObject*>>::
                   findBucketWithHash<QGesture*>
                             ((Data<QHashPrivate::Node<QGesture*,QGraphicsObject*>> *)this,
                              (QGesture **)(pEVar5 + bVar2),uVar9 >> 0x20 ^ this->seed ^ uVar9);
          pNVar7 = Span<QHashPrivate::Node<QGesture_*,_QGraphicsObject_*>_>::insert
                             (BVar14.span,BVar14.index);
          pQVar6 = *(QGraphicsObject **)(pEVar5[bVar2].storage.data + 8);
          pNVar7->key = *(QGesture **)pEVar5[bVar2].storage.data;
          pNVar7->value = pQVar6;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x80);
      if (pSVar4[uVar8].entries != (Entry *)0x0) {
        operator_delete__(pSVar4[uVar8].entries);
        pSVar4[uVar8].entries = (Entry *)0x0;
      }
      uVar8 = uVar8 + 1;
      pSVar10 = pSVar10 + 1;
    } while (uVar8 != uVar3 >> 7);
  }
  lVar11 = *(long *)&pSVar4[-1].allocated;
  if (lVar11 != 0) {
    lVar12 = lVar11 * 0x90;
    do {
      if (*(void **)(pSVar4->offsets + lVar12 + -0x10) != (void *)0x0) {
        operator_delete__(*(void **)(pSVar4->offsets + lVar12 + -0x10));
        puVar1 = pSVar4->offsets + lVar12 + -0x10;
        puVar1[0] = '\0';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        puVar1[4] = '\0';
        puVar1[5] = '\0';
        puVar1[6] = '\0';
        puVar1[7] = '\0';
      }
      lVar12 = lVar12 + -0x90;
    } while (lVar12 != 0);
  }
  operator_delete__(&pSVar4[-1].allocated,lVar11 * 0x90 + 8);
  return;
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }